

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractslider.cpp
# Opt level: O1

void __thiscall QAbstractSlider::setRange(QAbstractSlider *this,int min,int max)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long in_FS_OFFSET;
  undefined4 local_40;
  undefined4 local_3c;
  void *local_38;
  undefined4 *puStack_30;
  undefined4 *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&(this->super_QWidget).field_0x8;
  iVar1 = *(int *)(lVar3 + 0x254);
  iVar2 = *(int *)(lVar3 + 600);
  *(int *)(lVar3 + 0x254) = min;
  if (max < min) {
    max = min;
  }
  *(int *)(lVar3 + 600) = max;
  if ((iVar1 != min) || (iVar2 != max)) {
    (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,0);
    local_3c = *(undefined4 *)(lVar3 + 0x254);
    local_40 = *(undefined4 *)(lVar3 + 600);
    puStack_30 = &local_3c;
    local_28 = &local_40;
    local_38 = (void *)0x0;
    QMetaObject::activate((QObject *)this,&staticMetaObject,4,&local_38);
    setValue(this,*(int *)(lVar3 + 0x260));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSlider::setRange(int min, int max)
{
    Q_D(QAbstractSlider);
    int oldMin = d->minimum;
    int oldMax = d->maximum;
    d->minimum = min;
    d->maximum = qMax(min, max);
    if (oldMin != d->minimum || oldMax != d->maximum) {
        sliderChange(SliderRangeChange);
        emit rangeChanged(d->minimum, d->maximum);
        setValue(d->value); // re-bound
    }
}